

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

void helper_msa_ld_w_mipsel(CPUMIPSState_conflict2 *env,uint32_t wd,target_ulong_conflict addr)

{
  tcg_target_ulong tVar1;
  TCGMemOpIdx oi;
  long lVar2;
  uintptr_t unaff_retaddr;
  
  lVar2 = (ulong)wd * 0x10;
  oi = 0x723;
  if ((env->hflags >> 0x1c & 1) == 0) {
    oi = env->hflags & 3 | 0x720;
  }
  tVar1 = helper_le_ldul_mmu_mipsel((CPUArchState_conflict8 *)env,addr,oi,unaff_retaddr);
  (env->active_fpu).fpr[wd].fs[0] = (float32)tVar1;
  tVar1 = helper_le_ldul_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 4,oi,unaff_retaddr);
  *(int *)((long)(env->active_fpu).fpr + lVar2 + 4) = (int)tVar1;
  tVar1 = helper_le_ldul_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 8,oi,unaff_retaddr);
  *(int *)((long)(env->active_fpu).fpr + lVar2 + 8) = (int)tVar1;
  tVar1 = helper_le_ldul_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 0xc,oi,unaff_retaddr);
  *(int *)((long)(env->active_fpu).fpr + lVar2 + 0xc) = (int)tVar1;
  return;
}

Assistant:

void helper_msa_ld_w(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    MEMOP_IDX(DF_WORD)
#if !defined(HOST_WORDS_BIGENDIAN)
    pwd->w[0] = helper_ret_ldul_mmu(env, addr + (0 << DF_WORD), oi, GETPC());
    pwd->w[1] = helper_ret_ldul_mmu(env, addr + (1 << DF_WORD), oi, GETPC());
    pwd->w[2] = helper_ret_ldul_mmu(env, addr + (2 << DF_WORD), oi, GETPC());
    pwd->w[3] = helper_ret_ldul_mmu(env, addr + (3 << DF_WORD), oi, GETPC());
#else
    pwd->w[0] = helper_ret_ldul_mmu(env, addr + (1 << DF_WORD), oi, GETPC());
    pwd->w[1] = helper_ret_ldul_mmu(env, addr + (0 << DF_WORD), oi, GETPC());
    pwd->w[2] = helper_ret_ldul_mmu(env, addr + (3 << DF_WORD), oi, GETPC());
    pwd->w[3] = helper_ret_ldul_mmu(env, addr + (2 << DF_WORD), oi, GETPC());
#endif
}